

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qdockarealayout.cpp
# Opt level: O1

unique_ptr<QLayoutItem,_std::default_delete<QLayoutItem>_> __thiscall
QDockAreaLayoutInfo::takeWidgetItem(QDockAreaLayoutInfo *this,QWidget *widget)

{
  QDockAreaLayoutItem *pQVar1;
  QWidget *in_RDX;
  long in_FS_OFFSET;
  QList<int> local_38;
  long local_20;
  
  local_20 = *(long *)(in_FS_OFFSET + 0x28);
  this->sep = (int *)0x0;
  local_38.d.size = (qsizetype)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.d = (Data *)&DAT_aaaaaaaaaaaaaaaa;
  local_38.d.ptr = (int *)&DAT_aaaaaaaaaaaaaaaa;
  indexOf(&local_38,(QDockAreaLayoutInfo *)widget,in_RDX);
  if ((undefined1 *)local_38.d.size != (undefined1 *)0x0) {
    pQVar1 = item((QDockAreaLayoutInfo *)widget,&local_38);
    this->sep = (int *)pQVar1->widgetItem;
  }
  if (&(local_38.d.d)->super_QArrayData != (QArrayData *)0x0) {
    LOCK();
    ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i =
         ((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i + -1;
    UNLOCK();
    if (((local_38.d.d)->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i == 0) {
      QArrayData::deallocate(&(local_38.d.d)->super_QArrayData,4,0x10);
    }
  }
  if (*(long *)(in_FS_OFFSET + 0x28) == local_20) {
    return (__uniq_ptr_data<QLayoutItem,_std::default_delete<QLayoutItem>,_true,_true>)
           (__uniq_ptr_data<QLayoutItem,_std::default_delete<QLayoutItem>,_true,_true>)this;
  }
  __stack_chk_fail();
}

Assistant:

std::unique_ptr<QLayoutItem> QDockAreaLayoutInfo::takeWidgetItem(QWidget *widget)
{
    std::unique_ptr<QLayoutItem> widgetItem;
    if (const auto path = indexOf(widget); !path.isEmpty())
        widgetItem.reset(item(path).widgetItem);
    return widgetItem;
}